

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double geometric_cdf(int x,double a)

{
  __type _Var1;
  undefined8 local_20;
  double cdf;
  double a_local;
  int x_local;
  
  if (x < 1) {
    local_20 = 0.0;
  }
  else if ((a != 0.0) || (NAN(a))) {
    if ((a != 1.0) || (NAN(a))) {
      _Var1 = std::pow<double,int>(1.0 - a,x);
      local_20 = 1.0 - _Var1;
    }
    else {
      local_20 = 1.0;
    }
  }
  else {
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

double geometric_cdf ( int x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    GEOMETRIC_CDF evaluates the Geometric CDF.
//
//  Discussion:
//
//    CDF(X,P) is the probability that there will be at least one
//    successful trial in the first X Bernoulli trials, given that
//    the probability of success in a single trial is P.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the maximum number of trials.
//
//    Input, double A, the probability of success on one trial.
//    0.0 <= A <= 1.0.
//
//    Output, double GEOMETRIC_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x <= 0 )
  {
    cdf = 0.0;
  }
  else if ( a == 0.0 )
  {
    cdf = 0.0;
  }
  else if ( a == 1.0 )
  {
    cdf = 1.0;
  }
  else
  {
    cdf = 1.0 - pow ( ( 1.0 - a ), x );
  }

  return cdf;
}